

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O0

long __thiscall
wasm::Random::
pickGivenNum<long,short,int,int,long,long,unsigned_char,unsigned_short,unsigned_int,unsigned_long>
          (Random *this,size_t num,long first,short args,int args_1,int args_2,long args_3,
          long args_4,uchar args_5,unsigned_short args_6,uint args_7,unsigned_long args_8)

{
  int args_local_2;
  int args_local_1;
  short args_local;
  long first_local;
  size_t num_local;
  Random *this_local;
  
  this_local = (Random *)first;
  if (num != 0) {
    this_local = (Random *)
                 pickGivenNum<long,int,int,long,long,unsigned_char,unsigned_short,unsigned_int,unsigned_long>
                           (this,num - 1,(long)args,args_1,args_2,args_3,args_4,args_5,args_6,args_7
                            ,args_8);
  }
  return (long)this_local;
}

Assistant:

T pickGivenNum(size_t num, T first, Args... args) {
    if (num == 0) {
      return first;
    }
    return pickGivenNum<T>(num - 1, args...);
  }